

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileReader.cxx
# Opt level: O0

optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> *
cmReadGccDepfile(optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 *__return_storage_ptr__,char *filePath,string *prefix,
                GccDepfilePrependPaths prependPaths)

{
  bool bVar1;
  vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *this;
  reference this_00;
  ulong uVar2;
  string local_168;
  char local_141;
  string local_140;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  char local_d9;
  string local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rule;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGccStyleDependency *dep;
  iterator __end1;
  iterator __begin1;
  vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *__range1;
  undefined1 local_5d;
  undefined4 local_5c;
  undefined1 local_48 [8];
  cmGccDepfileLexerHelper helper;
  GccDepfilePrependPaths prependPaths_local;
  string *prefix_local;
  char *filePath_local;
  enable_if_t<is_constructible_v<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>,_std::vector<cmGccStyleDependency>_>,_optional<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>_>_>
  *deps;
  
  helper._28_4_ = prependPaths;
  cmGccDepfileLexerHelper::cmGccDepfileLexerHelper((cmGccDepfileLexerHelper *)local_48);
  bVar1 = cmGccDepfileLexerHelper::readFile((cmGccDepfileLexerHelper *)local_48,filePath);
  if (bVar1) {
    local_5d = 0;
    cmGccDepfileLexerHelper::extractContent
              ((cmGccDepfileContent *)&__range1,(cmGccDepfileLexerHelper *)local_48);
    std::make_optional<std::vector<cmGccStyleDependency,std::allocator<cmGccStyleDependency>>>
              (__return_storage_ptr__,
               (vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)&__range1);
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
              ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)&__range1);
    this = std::optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
           ::operator*(__return_storage_ptr__);
    __end1 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::begin(this);
    dep = (cmGccStyleDependency *)
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                       *)&dep), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                ::operator*(&__end1);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this_00->rules);
      rule = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this_00->rules);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&rule), bVar1) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
        if (((helper._28_4_ == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) &&
           (bVar1 = cmsys::SystemTools::FileIsFullPath(local_b8), !bVar1)) {
          local_d9 = '/';
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                    (&local_d8,prefix,&local_d9,local_b8);
          std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        bVar1 = cmsys::SystemTools::FileIsFullPath(local_b8);
        if (bVar1) {
          cmsys::SystemTools::CollapseFullPath((string *)&__range2_1,local_b8);
          std::__cxx11::string::operator=((string *)local_b8,(string *)&__range2_1);
          std::__cxx11::string::~string((string *)&__range2_1);
        }
        cmSystemTools::ConvertToLongPath(local_b8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this_00->paths);
      path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this_00->paths);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&path), bVar1) {
        local_120 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2_1);
        uVar2 = std::__cxx11::string::empty();
        if (((uVar2 & 1) == 0) && (bVar1 = cmsys::SystemTools::FileIsFullPath(local_120), !bVar1)) {
          local_141 = '/';
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                    (&local_140,prefix,&local_141,local_120);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        bVar1 = cmsys::SystemTools::FileIsFullPath(local_120);
        if (bVar1) {
          cmsys::SystemTools::CollapseFullPath(&local_168,local_120);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
        }
        cmSystemTools::ConvertToLongPath(local_120);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      __gnu_cxx::
      __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ::operator++(&__end1);
    }
    local_5d = 1;
  }
  else {
    std::optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>::
    optional(__return_storage_ptr__);
  }
  local_5c = 1;
  cmGccDepfileLexerHelper::~cmGccDepfileLexerHelper((cmGccDepfileLexerHelper *)local_48);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGccDepfileContent> cmReadGccDepfile(
  const char* filePath, const std::string& prefix,
  GccDepfilePrependPaths prependPaths)
{
  cmGccDepfileLexerHelper helper;
  if (!helper.readFile(filePath)) {
    return cm::nullopt;
  }
  auto deps = cm::make_optional(std::move(helper).extractContent());

  for (auto& dep : *deps) {
    for (auto& rule : dep.rules) {
      if (prependPaths == GccDepfilePrependPaths::All && !prefix.empty() &&
          !cmSystemTools::FileIsFullPath(rule)) {
        rule = cmStrCat(prefix, '/', rule);
      }
      if (cmSystemTools::FileIsFullPath(rule)) {
        rule = cmSystemTools::CollapseFullPath(rule);
      }
      cmSystemTools::ConvertToLongPath(rule);
    }
    for (auto& path : dep.paths) {
      if (!prefix.empty() && !cmSystemTools::FileIsFullPath(path)) {
        path = cmStrCat(prefix, '/', path);
      }
      if (cmSystemTools::FileIsFullPath(path)) {
        path = cmSystemTools::CollapseFullPath(path);
      }
      cmSystemTools::ConvertToLongPath(path);
    }
  }

  return deps;
}